

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O3

int __thiscall musicBlock::releaseSustain(musicBlock *this,uint channel)

{
  OPLio *this_00;
  channelEntry *pcVar1;
  ulong uVar2;
  
  this_00 = this->io;
  if (this_00->OPLchannels != 0) {
    pcVar1 = this->channels;
    uVar2 = 0;
    do {
      if ((pcVar1->channel == channel) && ((pcVar1->flags & 2) != 0)) {
        OPLio::OPLwriteFreq(this_00,(uint)uVar2,(uint)pcVar1->realnote,pcVar1->pitch,0);
        pcVar1->channel = pcVar1->channel | 0x80;
        pcVar1->time = this->MLtime;
        pcVar1->flags = 0x80;
        this_00 = this->io;
      }
      uVar2 = uVar2 + 1;
      pcVar1 = pcVar1 + 1;
    } while (uVar2 < this_00->OPLchannels);
  }
  return 0;
}

Assistant:

int musicBlock::releaseSustain(uint channel)
{
	uint i;
	uint id = channel;

	for(i = 0; i < io->OPLchannels; i++)
	{
		if (channels[i].channel == id && channels[i].flags & CH_SUSTAIN)
			releaseChannel(i, 0);
	}
	return 0;
}